

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::OptionalMatcher<const_char_*>::Impl<const_std::optional<const_char_*>_&>::
MatchAndExplain(Impl<const_std::optional<const_char_*>_&> *this,optional<const_char_*> *optional,
               MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *pMVar2;
  char **value;
  StringMatchResultListener value_listener;
  string local_1e0;
  char *local_1c0;
  StringMatchResultListener local_1b8;
  
  if ((optional->super__Optional_base<const_char_*,_true,_true>)._M_payload.
      super__Optional_payload_base<const_char_*>._M_engaged == false) {
    MatchResultListener::operator<<(listener,(char (*) [21])"which is not engaged");
    bVar1 = false;
  }
  else {
    StringMatchResultListener::StringMatchResultListener(&local_1b8);
    bVar1 = MatcherBase<const_char_*>::MatchAndExplain
                      (&(this->value_matcher_).super_MatcherBase<const_char_*>,(char **)optional,
                       &local_1b8.super_MatchResultListener);
    pMVar2 = MatchResultListener::operator<<(listener,(char (*) [13])"whose value ");
    PrintToString<char_const*>(&local_1e0,(testing *)optional,value);
    pMVar2 = MatchResultListener::operator<<(pMVar2,&local_1e0);
    local_1c0 = " doesn\'t match";
    if (bVar1) {
      local_1c0 = " matches";
    }
    MatchResultListener::operator<<(pMVar2,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1e0,listener->stream_);
    std::__cxx11::string::~string((string *)&local_1e0);
    StringMatchResultListener::~StringMatchResultListener(&local_1b8);
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(Optional optional,
                         MatchResultListener* listener) const override {
      if (!optional) {
        *listener << "which is not engaged";
        return false;
      }
      const ValueType& value = *optional;
      StringMatchResultListener value_listener;
      const bool match = value_matcher_.MatchAndExplain(value, &value_listener);
      *listener << "whose value " << PrintToString(value)
                << (match ? " matches" : " doesn't match");
      PrintIfNotEmpty(value_listener.str(), listener->stream());
      return match;
    }